

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O1

void __thiscall ArgsManager::AddCommand(ArgsManager *this,string *cmd,string *help)

{
  pointer pcVar1;
  bool bVar2;
  void *pvVar3;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ArgsManager::Arg>,std::_Select1st<std::pair<std::__cxx11::string_const,ArgsManager::Arg>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ArgsManager::Arg>>>
  *this_00;
  undefined8 uVar4;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg>_>,_bool>
  pVar5;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock16;
  bool local_90 [8];
  unique_lock<std::recursive_mutex> local_88;
  undefined1 local_78 [32];
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  uint local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (cmd->_M_string_length == 0) {
    bVar2 = true;
  }
  else {
    pcVar1 = (cmd->_M_dataplus)._M_p;
    pvVar3 = memchr(pcVar1,0x3d,cmd->_M_string_length);
    bVar2 = (long)pvVar3 - (long)pcVar1 == -1 || pvVar3 == (void *)0x0;
  }
  local_78[0] = bVar2;
  inline_assertion_check<true,bool>
            ((bool *)local_78,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/common/args.cpp"
             ,0x22a,"AddCommand","cmd.find(\'=\') == std::string::npos");
  if (cmd->_M_string_length == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      uVar4 = std::__throw_out_of_range_fmt
                        ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",0);
      std::unique_lock<std::recursive_mutex>::~unique_lock(&local_88);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        _Unwind_Resume(uVar4);
      }
    }
  }
  else {
    local_78[0] = *(cmd->_M_dataplus)._M_p != '-';
    inline_assertion_check<true,bool>
              ((bool *)local_78,
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/common/args.cpp"
               ,0x22b,"AddCommand","cmd.at(0) != \'-\'");
    local_88._M_owns = false;
    local_88._M_device = (mutex_type *)this;
    std::unique_lock<std::recursive_mutex>::lock(&local_88);
    this->m_accept_any_command = false;
    local_78._0_4_ = 0xb;
    this_00 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ArgsManager::Arg>,std::_Select1st<std::pair<std::__cxx11::string_const,ArgsManager::Arg>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ArgsManager::Arg>>>
               *)std::
                 map<OptionsCategory,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg>_>_>,_std::less<OptionsCategory>,_std::allocator<std::pair<const_OptionsCategory,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg>_>_>_>_>_>
                 ::operator[](&this->m_available_args,(key_type *)local_78);
    local_78._0_8_ = local_78 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"");
    pcVar1 = (help->_M_dataplus)._M_p;
    local_58._M_p = (pointer)&local_48;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,pcVar1,pcVar1 + help->_M_string_length);
    local_38 = 0x800;
    pVar5 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ArgsManager::Arg>,std::_Select1st<std::pair<std::__cxx11::string_const,ArgsManager::Arg>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ArgsManager::Arg>>>
            ::_M_emplace_unique<std::__cxx11::string_const&,ArgsManager::Arg>
                      (this_00,cmd,(Arg *)local_78);
    local_90[0] = pVar5.second;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_p != &local_48) {
      operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
      operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
    }
    inline_assertion_check<true,bool&>
              (local_90,
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/common/args.cpp"
               ,0x231,"AddCommand","ret.second");
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_88);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void ArgsManager::AddCommand(const std::string& cmd, const std::string& help)
{
    Assert(cmd.find('=') == std::string::npos);
    Assert(cmd.at(0) != '-');

    LOCK(cs_args);
    m_accept_any_command = false; // latch to false
    std::map<std::string, Arg>& arg_map = m_available_args[OptionsCategory::COMMANDS];
    auto ret = arg_map.emplace(cmd, Arg{"", help, ArgsManager::COMMAND});
    Assert(ret.second); // Fail on duplicate commands
}